

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutPool.cpp
# Opt level: O3

uint64_t compute_cut_hash(HighsInt *Rindex,double *Rvalue,double maxabscoef,HighsInt Rlen)

{
  u32 uVar1;
  u64 uVar2;
  u64 uVar3;
  size_type __n;
  ulong uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> valueHashCodes;
  allocator_type local_51;
  double local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  __n = (size_type)Rlen;
  local_50 = maxabscoef;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__n,&local_51);
  if (0 < Rlen) {
    local_50 = 1.0 / local_50;
    uVar4 = 0;
    do {
      uVar1 = HighsHashHelpers::double_hash_code(Rvalue[uVar4] * local_50);
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = uVar1;
      uVar4 = uVar4 + 1;
    } while ((uint)Rlen != uVar4);
  }
  uVar2 = HighsHashHelpers::vector_hash<int,_0>(Rindex,__n);
  uVar3 = HighsHashHelpers::vector_hash<unsigned_int,_0>
                    (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,__n);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return uVar3 >> 0x20 ^ uVar2;
}

Assistant:

static uint64_t compute_cut_hash(const HighsInt* Rindex, const double* Rvalue,
                                 double maxabscoef, const HighsInt Rlen) {
  std::vector<uint32_t> valueHashCodes(Rlen);

  double scale = 1.0 / maxabscoef;
  for (HighsInt i = 0; i < Rlen; ++i)
    valueHashCodes[i] = HighsHashHelpers::double_hash_code(scale * Rvalue[i]);

  return HighsHashHelpers::vector_hash(Rindex, Rlen) ^
         (HighsHashHelpers::vector_hash(valueHashCodes.data(), Rlen) >> 32);
}